

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O3

int32 read_mixw(s2_semi_mgau_t *s,char *file_name,double SmoothMin)

{
  bool bVar1;
  uint8 uVar2;
  int32 iVar3;
  int iVar4;
  uint uVar5;
  FILE *pFVar6;
  uint8 ***pppuVar7;
  float32 *vec;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char **ppcVar14;
  long lVar15;
  char cVar16;
  float64 fVar17;
  int32 n_comp;
  int32 byteswap;
  int32 n_sen;
  uint32 chksum;
  int32 n_feat;
  char eofchk;
  char **argval;
  char **argname;
  int32 n;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar18;
  uint local_80;
  char local_79;
  int32 local_78;
  uint local_74;
  uint32 local_70;
  uint local_6c;
  char *local_68;
  undefined1 local_5d;
  int local_5c;
  char **local_58;
  char **local_50;
  int local_44;
  FILE *local_40;
  double local_38;
  
  local_38 = SmoothMin;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,0x44c,"Reading mixture weights file \'%s\'\n",file_name);
  local_68 = file_name;
  pFVar6 = fopen(file_name,"rb");
  if (pFVar6 == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                   ,0x44f,"Failed to open mixture weights file \'%s\' for reading",local_68);
    goto LAB_00141fce;
  }
  iVar3 = bio_readhdr((FILE *)pFVar6,&local_50,&local_58,&local_78);
  if (iVar3 < 0) {
    pcVar9 = "Failed to read header from file \'%s\'\n";
    lVar11 = 0x453;
  }
  else {
    pcVar9 = *local_50;
    local_40 = pFVar6;
    if (pcVar9 == (char *)0x0) {
      cVar16 = true;
      uVar13 = 0;
    }
    else {
      uVar13 = 0;
      bVar1 = false;
      ppcVar14 = local_50;
      do {
        iVar4 = strcmp(pcVar9,"version");
        if (iVar4 == 0) {
          pcVar9 = local_58[uVar13];
          iVar4 = strcmp(pcVar9,"1.0");
          if (iVar4 != 0) {
            in_stack_ffffffffffffff68 = 0;
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                    ,0x45b,"Version mismatch(%s): %s, expecting %s\n",local_68,pcVar9,"1.0");
            ppcVar14 = local_50;
          }
        }
        else {
          iVar4 = strcmp(pcVar9,"chksum0");
          if (iVar4 == 0) {
            bVar1 = true;
          }
        }
        pcVar9 = ppcVar14[uVar13 + 1];
        uVar13 = uVar13 + 1;
      } while (pcVar9 != (char *)0x0);
      cVar16 = !bVar1;
      local_50 = ppcVar14;
    }
    pFVar6 = local_40;
    bio_hdrarg_free(local_50,local_58);
    local_58 = (char **)0x0;
    local_50 = (char **)0x0;
    local_70 = 0;
    iVar3 = bio_fread(&local_74,4,1,(FILE *)pFVar6,local_78,&local_70);
    if ((((iVar3 == 1) &&
         (iVar3 = bio_fread(&local_6c,4,1,(FILE *)pFVar6,local_78,&local_70), iVar3 == 1)) &&
        (iVar3 = bio_fread(&local_80,4,1,(FILE *)pFVar6,local_78,&local_70), iVar3 == 1)) &&
       (iVar3 = bio_fread(&local_44,4,1,(FILE *)pFVar6,local_78,&local_70), iVar3 == 1)) {
      if (local_6c != s->g->n_feat) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x470,"#Features streams(%d) != %d\n");
        goto LAB_00141fce;
      }
      if (local_44 != local_74 * local_6c * local_80) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x474,"%s: #float32s(%d) doesn\'t match header dimensions: %d x %d x %d\n",local_68
                ,uVar13 & 0xffffffff,
                CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),local_74),local_6c,local_80
               );
        goto LAB_00141fce;
      }
      s->n_sen = local_74;
      pppuVar7 = (uint8 ***)
                 __ckd_calloc_3d__((long)(int)local_6c,(long)s->g->n_density,(long)(int)local_74,1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                                   ,0x47d);
      s->mixw = pppuVar7;
      vec = (float32 *)
            __ckd_calloc__((long)(int)local_80,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                           ,0x480);
      uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
      if (0 < (int)local_74) {
        lVar11 = 0;
        uVar13 = (ulong)local_6c;
        local_5c = 0;
        uVar5 = local_74;
        local_79 = cVar16;
        do {
          if (0 < (int)uVar13) {
            uVar10 = (ulong)local_80;
            lVar15 = 0;
            do {
              uVar5 = bio_fread(vec,4,(int32)uVar10,(FILE *)pFVar6,local_78,&local_70);
              if (uVar5 != local_80) {
                pcVar9 = "bio_fread(%s) (arraydata) failed\n";
                lVar11 = 0x488;
                goto LAB_00141fbd;
              }
              fVar17 = vector_sum_norm(vec,uVar5);
              local_5c = (local_5c + 1) - (uint)(0.0 < (double)fVar17);
              vector_floor(vec,local_80,(float64)local_38);
              vector_sum_norm(vec,local_80);
              uVar10 = (ulong)local_80;
              if (0 < (int)local_80) {
                lVar12 = 0;
                do {
                  iVar4 = logmath_log(s->lmath_8b,(float64)(double)(float)vec[lVar12]);
                  uVar2 = -(char)iVar4;
                  if (iVar4 - 1U < 0xffffff60) {
                    uVar2 = 0x9f;
                  }
                  s->mixw[lVar15][lVar12][lVar11] = uVar2;
                  lVar12 = lVar12 + 1;
                  uVar10 = (ulong)(int)local_80;
                  pFVar6 = local_40;
                } while (lVar12 < (long)uVar10);
              }
              lVar15 = lVar15 + 1;
              uVar13 = (ulong)(int)local_6c;
              uVar5 = local_74;
            } while (lVar15 < (long)uVar13);
          }
          cVar16 = local_79;
          uVar18 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
          lVar11 = lVar11 + 1;
        } while (lVar11 < (int)uVar5);
        if (0 < local_5c) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                  ,0x49d,"Weight normalization failed for %d mixture weights components\n");
        }
      }
      ckd_free(vec);
      if (cVar16 == '\0') {
        bio_verify_chksum((FILE *)pFVar6,local_78,local_70);
      }
      sVar8 = fread(&local_5d,1,1,pFVar6);
      if (sVar8 != 1) {
        fclose(pFVar6);
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
                ,0x4a9,"Read %d x %d x %d mixture weights\n",(ulong)local_74,(ulong)local_6c,
                CONCAT44(uVar18,local_80));
        return local_74;
      }
      pcVar9 = "More data than expected in %s\n";
      lVar11 = 0x4a5;
    }
    else {
      pcVar9 = "bio_fread(%s) (arraysize) failed\n";
      lVar11 = 0x46d;
    }
  }
LAB_00141fbd:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/s2_semi_mgau.c"
          ,lVar11,pcVar9,local_68);
LAB_00141fce:
  exit(1);
}

Assistant:

static int32
read_mixw(ptm_mgau_t * s, char const *file_name, double SmoothMin)
{
    char **argname, **argval;
    char eofchk;
    FILE *fp;
    int32 byteswap, chksum_present;
    uint32 chksum;
    float32 *pdf;
    int32 i, f, c, n;
    int32 n_sen;
    int32 n_feat;
    int32 n_comp;
    int32 n_err;

    E_INFO("Reading mixture weights file '%s'\n", file_name);

    if ((fp = fopen(file_name, "rb")) == NULL)
        E_FATAL_SYSTEM("Failed to open mixture file '%s' for reading", file_name);

    /* Read header, including argument-value info and 32-bit byteorder magic */
    if (bio_readhdr(fp, &argname, &argval, &byteswap) < 0)
        E_FATAL("Failed to read header from '%s'\n", file_name);

    /* Parse argument-value list */
    chksum_present = 0;
    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], MGAU_MIXW_VERSION) != 0)
                E_WARN("Version mismatch(%s): %s, expecting %s\n",
                       file_name, argval[i], MGAU_MIXW_VERSION);
        }
        else if (strcmp(argname[i], "chksum0") == 0) {
            chksum_present = 1; /* Ignore the associated value */
        }
    }
    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    /* Read #senones, #features, #codewords, arraysize */
    if ((bio_fread(&n_sen, sizeof(int32), 1, fp, byteswap, &chksum) != 1)
        || (bio_fread(&n_feat, sizeof(int32), 1, fp, byteswap, &chksum) !=
            1)
        || (bio_fread(&n_comp, sizeof(int32), 1, fp, byteswap, &chksum) !=
            1)
        || (bio_fread(&n, sizeof(int32), 1, fp, byteswap, &chksum) != 1)) {
        E_FATAL("bio_fread(%s) (arraysize) failed\n", file_name);
    }
    if (n_feat != s->g->n_feat)
        E_FATAL("#Features streams(%d) != %d\n", n_feat, s->g->n_feat);
    if (n != n_sen * n_feat * n_comp) {
        E_FATAL
            ("%s: #float32s(%d) doesn't match header dimensions: %d x %d x %d\n",
             file_name, i, n_sen, n_feat, n_comp);
    }

    /* n_sen = number of mixture weights per codeword, which is
     * fixed at the number of senones since we have only one codebook.
     */
    s->n_sen = n_sen;

    /* Quantized mixture weight arrays. */
    s->mixw = ckd_calloc_3d(s->g->n_feat, s->g->n_density,
                            n_sen, sizeof(***s->mixw));

    /* Temporary structure to read in floats before conversion to (int32) logs3 */
    pdf = (float32 *) ckd_calloc(n_comp, sizeof(float32));

    /* Read senone probs data, normalize, floor, convert to logs3, truncate to 8 bits */
    n_err = 0;
    for (i = 0; i < n_sen; i++) {
        for (f = 0; f < n_feat; f++) {
            if (bio_fread((void *) pdf, sizeof(float32),
                          n_comp, fp, byteswap, &chksum) != n_comp) {
                E_FATAL("bio_fread(%s) (arraydata) failed\n", file_name);
            }

            /* Normalize and floor */
            if (vector_sum_norm(pdf, n_comp) <= 0.0)
                n_err++;
            vector_floor(pdf, n_comp, SmoothMin);
            vector_sum_norm(pdf, n_comp);

            /* Convert to LOG, quantize, and transpose */
            for (c = 0; c < n_comp; c++) {
                int32 qscr;

                qscr = -logmath_log(s->lmath_8b, pdf[c]);
                if ((qscr > MAX_NEG_MIXW) || (qscr < 0))
                    qscr = MAX_NEG_MIXW;
                s->mixw[f][c][i] = qscr;
            }
        }
    }
    if (n_err > 0)
        E_WARN("Weight normalization failed for %d mixture weights components\n", n_err);

    ckd_free(pdf);

    if (chksum_present)
        bio_verify_chksum(fp, byteswap, chksum);

    if (fread(&eofchk, 1, 1, fp) == 1)
        E_FATAL("More data than expected in %s\n", file_name);

    fclose(fp);

    E_INFO("Read %d x %d x %d mixture weights\n", n_sen, n_feat, n_comp);
    return n_sen;
}